

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadRegionsBuilder.cpp
# Opt level: O2

void __thiscall ThreadRegionsBuilder::ThreadRegionsBuilder(ThreadRegionsBuilder *this,size_t size)

{
  _Rb_tree_header *p_Var1;
  allocator_type local_16;
  key_equal local_15;
  hash<Node_*> local_14;
  allocator_type local_13;
  key_equal local_12;
  hash<Node_*> local_11;
  
  std::
  _Hashtable<Node_*,_std::pair<Node_*const,_ThreadRegion_*>,_std::allocator<std::pair<Node_*const,_ThreadRegion_*>_>,_std::__detail::_Select1st,_std::equal_to<Node_*>,_std::hash<Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable((_Hashtable<Node_*,_std::pair<Node_*const,_ThreadRegion_*>,_std::allocator<std::pair<Node_*const,_ThreadRegion_*>_>,_std::__detail::_Select1st,_std::equal_to<Node_*>,_std::hash<Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)this,size,&local_11,&local_12,&local_13);
  std::
  _Hashtable<Node_*,_std::pair<Node_*const,_ThreadRegion_*>,_std::allocator<std::pair<Node_*const,_ThreadRegion_*>_>,_std::__detail::_Select1st,_std::equal_to<Node_*>,_std::hash<Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&(this->examinedNodeToRegionMap)._M_h,size,&local_14,&local_15,&local_16);
  p_Var1 = &(this->threadRegions_)._M_t._M_impl.super__Rb_tree_header;
  (this->threadRegions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->threadRegions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->threadRegions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->threadRegions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->threadRegions_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

ThreadRegionsBuilder::ThreadRegionsBuilder(std::size_t size)
        : visitedNodeToRegionMap(size), examinedNodeToRegionMap(size) {}